

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall
autoSimplification_commutative3_Test::~autoSimplification_commutative3_Test
          (autoSimplification_commutative3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, commutative3)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const n4 = 4_i;
    auto const x = symbol("x");
    auto const e = (x ^ n3) + (x ^ n2) + (x ^ n4);
    EXPECT_EQ(toString(e), "(+ (^ x 2) (^ x 3) (^ x 4))");
}